

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTargetPropertyCommand.h
# Opt level: O0

void __thiscall
cmGetTargetPropertyCommand::~cmGetTargetPropertyCommand(cmGetTargetPropertyCommand *this)

{
  cmGetTargetPropertyCommand *this_local;
  
  ~cmGetTargetPropertyCommand(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmGetTargetPropertyCommand; }